

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<int>::btAlignedObjectArray
          (btAlignedObjectArray<int> *this,btAlignedObjectArray<int> *otherArray)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  this->m_ownsMemory = true;
  this->m_data = (int *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  iVar1 = otherArray->m_size;
  lVar6 = (long)iVar1;
  if ((-1 < lVar6) && (iVar1 != 0)) {
    piVar4 = (int *)btAlignedAllocInternal(lVar6 * 4,0x10);
    iVar2 = this->m_size;
    if (0 < (long)iVar2) {
      piVar3 = this->m_data;
      lVar5 = 0;
      do {
        piVar4[lVar5] = piVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
    }
    if (this->m_data != (int *)0x0) {
      if (this->m_ownsMemory == true) {
        btAlignedFreeInternal(this->m_data);
      }
      this->m_data = (int *)0x0;
    }
    this->m_ownsMemory = true;
    this->m_data = piVar4;
    this->m_capacity = iVar1;
    if (iVar1 != 0) {
      memset(this->m_data,0,lVar6 * 4);
    }
  }
  this->m_size = iVar1;
  if (0 < iVar1) {
    piVar4 = this->m_data;
    piVar3 = otherArray->m_data;
    lVar5 = 0;
    do {
      piVar4[lVar5] = piVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}